

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5_utils.c
# Opt level: O3

void MD5Update(MD5Context *ctx,uchar *buf,uint len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  size_t __n;
  uint uVar9;
  uint *in;
  
  uVar9 = ctx->bytes[0];
  ctx->bytes[0] = uVar9 + len;
  if (CARRY4(uVar9,len)) {
    ctx->bytes[1] = ctx->bytes[1] + 1;
  }
  uVar8 = 0x40 - (ulong)(uVar9 & 0x3f);
  uVar9 = len - (uint)uVar8;
  if (len < (uint)uVar8) {
    in = (uint *)((long)ctx + (0x58 - uVar8));
    __n = (size_t)len;
  }
  else {
    in = ctx->in;
    uVar8 = uVar8 & 0xffffffff;
    memcpy((void *)((long)ctx + (0x58 - uVar8)),buf,uVar8);
    MD5Transform(ctx->buf,in);
    buf = buf + uVar8;
    for (; 0x3f < uVar9; uVar9 = uVar9 - 0x40) {
      uVar1 = *(undefined8 *)buf;
      uVar2 = *(undefined8 *)(buf + 8);
      uVar3 = *(undefined8 *)(buf + 0x10);
      uVar4 = *(undefined8 *)(buf + 0x18);
      uVar5 = *(undefined8 *)(buf + 0x20);
      uVar6 = *(undefined8 *)(buf + 0x28);
      uVar7 = *(undefined8 *)(buf + 0x38);
      *(undefined8 *)(ctx->in + 0xc) = *(undefined8 *)(buf + 0x30);
      *(undefined8 *)(ctx->in + 0xe) = uVar7;
      *(undefined8 *)(ctx->in + 8) = uVar5;
      *(undefined8 *)(ctx->in + 10) = uVar6;
      *(undefined8 *)(ctx->in + 4) = uVar3;
      *(undefined8 *)(ctx->in + 6) = uVar4;
      *(undefined8 *)in = uVar1;
      *(undefined8 *)(ctx->in + 2) = uVar2;
      MD5Transform(ctx->buf,in);
      buf = buf + 0x40;
    }
    __n = (size_t)uVar9;
  }
  memcpy(in,buf,__n);
  return;
}

Assistant:

void MD5Update(struct MD5Context *ctx, md5byte const *buf, unsigned len) {
  UWORD32 t;

  /* Update byte count */

  t = ctx->bytes[0];

  if ((ctx->bytes[0] = t + len) < t)
    ctx->bytes[1]++; /* Carry from low to high */

  t = 64 - (t & 0x3f); /* Space available in ctx->in (at least 1) */

  if (t > len) {
    memcpy((md5byte *)ctx->in + 64 - t, buf, len);
    return;
  }

  /* First chunk is an odd size */
  memcpy((md5byte *)ctx->in + 64 - t, buf, t);
  byteSwap(ctx->in, 16);
  MD5Transform(ctx->buf, ctx->in);
  buf += t;
  len -= t;

  /* Process data in 64-byte chunks */
  while (len >= 64) {
    memcpy(ctx->in, buf, 64);
    byteSwap(ctx->in, 16);
    MD5Transform(ctx->buf, ctx->in);
    buf += 64;
    len -= 64;
  }

  /* Handle any remaining bytes of data. */
  memcpy(ctx->in, buf, len);
}